

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void hash_set(void *data,char *key,char *value)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  linkedlist_t *element;
  size_t length;
  linkedlist_t *map;
  size_t local_28;
  long *local_20;
  
  if (in_RSI != (char *)0x0) {
    local_28 = 0;
    local_20 = in_RDI;
    if (in_RDX != (char *)0x0) {
      local_28 = strlen(in_RDX);
      local_28 = local_28 + 1;
    }
    for (; local_20 != (long *)0x0; local_20 = (long *)local_20[2]) {
      if ((*local_20 != 0) && (iVar1 = strcmp((char *)*local_20,in_RSI), iVar1 == 0)) {
        if (local_20[1] != 0) {
          free((void *)local_20[1]);
        }
        if (in_RDX != (char *)0x0) {
          pvVar2 = malloc(local_28);
          local_20[1] = (long)pvVar2;
          strcpy((char *)local_20[1],in_RDX);
          return;
        }
        local_20[1] = 0;
        return;
      }
    }
    puVar3 = (undefined8 *)malloc(0x18);
    if (in_RDX == (char *)0x0) {
      puVar3[1] = 0;
    }
    else {
      pvVar2 = malloc(local_28);
      puVar3[1] = pvVar2;
      strcpy((char *)puVar3[1],in_RDX);
    }
    sVar4 = strlen(in_RSI);
    pvVar2 = malloc(sVar4 + 1);
    *puVar3 = pvVar2;
    strcpy((char *)*puVar3,in_RSI);
    puVar3[2] = in_RDI[2];
    in_RDI[2] = (long)puVar3;
  }
  return;
}

Assistant:

void hash_set(void *data, char *key, char *value) {
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)...\n", key, value);
#endif
	linkedlist_t *map = (linkedlist_t *) data;

	if ( key == NULL ) {
#ifdef DEBUG
		printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
		return;
	}

	size_t length = 0;
	if ( value != NULL ) {
		length = strlen(value) + 1;
	}
	while ( map != NULL ) {
		if ( map->key != NULL && !strcmp(map->key, key) ) {
			if ( map->value != NULL ) {
				free(map->value);
			}
			if ( value != NULL ) {
				map->value = (char *) malloc(sizeof(char) * length);
				strcpy(map->value, value);
			} else {
				map->value = NULL;
			}
			return;
		}
		map = map->next;
	}

	linkedlist_t *element = (linkedlist_t *) malloc(sizeof(linkedlist_t));
	if ( value != NULL ) {
		element->value = (char *) malloc(sizeof(char) * length);
		strcpy(element->value, value);
	} else {
		element->value = NULL;
	}

	length = strlen(key) + 1;
	element->key = (char *) malloc(sizeof(char) * length);
	strcpy(element->key, key);

	map = (linkedlist_t *) data;
	element->next = map->next;
	map->next = element;
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
}